

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocBranch
          (RALocalAllocator *this,InstNode *node,RABlock *target,RABlock *cont)

{
  uint **ppuVar1;
  uint **ppuVar2;
  uint uVar3;
  BaseNode *node_00;
  WorkToPhysMap *pWVar4;
  BaseCompiler *pBVar5;
  PhysToWorkMap *pPVar6;
  PhysToWorkMap *pPVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  Error EVar11;
  RABlock *pRVar12;
  BaseNode *pBVar13;
  Error unaff_EBX;
  long lVar14;
  bool bVar15;
  Label trampoline;
  Label savedTarget;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (this->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
  if ((*(PhysToWorkMap **)(target + 200) != (PhysToWorkMap *)0x0) &&
     (unaff_EBX = switchToAssignment(this,*(PhysToWorkMap **)(target + 200),
                                     (ZoneBitVector *)(target + 0x78),
                                     SUB41((*(uint *)(target + 0xc) & 8) >> 3,0),true),
     unaff_EBX != 0)) {
    return unaff_EBX;
  }
  EVar11 = allocInst(this,node);
  if (EVar11 != 0) {
    return EVar11;
  }
  uVar3 = *(uint *)(target + 0xb8);
  if ((ulong)uVar3 == 0xffffffff) {
    pRVar12 = target + 0xbc;
LAB_001251fe:
    EVar11 = spillScratchGpRegsBeforeEntry(this,*(RegMask *)pRVar12);
    if (EVar11 != 0) {
      return EVar11;
    }
    if (*(long *)(target + 200) == 0) {
      EVar11 = BaseRAPass::setBlockEntryAssignment
                         (this->_pass,target,this->_block,&this->_curAssignment);
      if (EVar11 == 0) {
        return 0;
      }
      return EVar11;
    }
    node_00 = *(BaseNode **)this->_pass->_extraBlock;
    pBVar13 = BaseBuilder::setCursor(&this->_cc->super_BaseBuilder,node_00);
    pWVar4 = (this->_curAssignment)._workToPhysMap;
    memcpy((this->_tmpAssignment)._physToWorkMap,(this->_curAssignment)._physToWorkMap,
           (ulong)(this->_tmpAssignment)._layout.physTotal * 4 + 0x20);
    memcpy((this->_tmpAssignment)._workToPhysMap,pWVar4,
           (ulong)(this->_tmpAssignment)._layout.workCount);
    bVar15 = false;
    EVar11 = switchToAssignment(this,*(PhysToWorkMap **)(target + 200),
                                (ZoneBitVector *)(target + 0x78),
                                SUB41((*(uint *)(target + 0xc) & 8) >> 3,0),false);
    if (EVar11 != 0) goto LAB_001253bb;
    EVar11 = unaff_EBX;
    if ((this->_cc->super_BaseBuilder)._cursor != node_00) {
      target = (RABlock *)pBVar13;
      if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_001253d8;
      lVar14 = (ulong)((byte)node[0x12] - 1) * 0x10;
      if ((*(uint *)(node + lVar14 + 0x40) & 7) != 5) goto LAB_001253dd;
      (*(this->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&local_58);
      local_48 = *(undefined8 *)(node + lVar14 + 0x40);
      uStack_40 = *(undefined8 *)(node + lVar14 + 0x48);
      *(undefined4 *)(node + lVar14 + 0x40) = local_58;
      *(undefined4 *)(node + lVar14 + 0x44) = uStack_54;
      *(undefined4 *)(node + lVar14 + 0x48) = uStack_50;
      *(undefined4 *)(node + lVar14 + 0x4c) = uStack_4c;
      node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
      EVar11 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
      bVar15 = EVar11 == 0;
      if (bVar15) {
        pBVar5 = this->_cc;
        (pBVar5->super_BaseBuilder)._cursor = node_00;
        (*(pBVar5->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])(pBVar5,&local_58);
        EVar11 = unaff_EBX;
      }
      goto LAB_00125340;
    }
  }
  else {
    if (uVar3 < *(uint *)(*(long *)target + 0xf0)) {
      pRVar12 = (RABlock *)((ulong)uVar3 * 0x20 + *(long *)(*(long *)target + 0xe8));
      goto LAB_001251fe;
    }
    allocBranch();
LAB_001253d8:
    allocBranch();
LAB_001253dd:
    EVar11 = 3;
    bVar15 = false;
    pBVar13 = (BaseNode *)target;
LAB_00125340:
    if (!bVar15) {
      bVar15 = false;
      goto LAB_001253bb;
    }
  }
  (this->_cc->super_BaseBuilder)._cursor = pBVar13;
  pWVar4 = (this->_curAssignment)._workToPhysMap;
  pPVar6 = (this->_curAssignment)._physToWorkMap;
  pPVar7 = (this->_tmpAssignment)._physToWorkMap;
  (this->_curAssignment)._workToPhysMap = (this->_tmpAssignment)._workToPhysMap;
  (this->_curAssignment)._physToWorkMap = pPVar7;
  (this->_tmpAssignment)._workToPhysMap = pWVar4;
  (this->_tmpAssignment)._physToWorkMap = pPVar6;
  lVar14 = 0;
  do {
    ppuVar1 = (this->_curAssignment)._physToWorkIds._data + lVar14;
    puVar8 = *ppuVar1;
    puVar9 = ppuVar1[1];
    ppuVar2 = (this->_tmpAssignment)._physToWorkIds._data + lVar14;
    puVar10 = ppuVar2[1];
    ppuVar1 = (this->_curAssignment)._physToWorkIds._data + lVar14;
    *ppuVar1 = *ppuVar2;
    ppuVar1[1] = puVar10;
    ppuVar1 = (this->_tmpAssignment)._physToWorkIds._data + lVar14;
    *ppuVar1 = puVar8;
    ppuVar1[1] = puVar9;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 4);
  bVar15 = true;
LAB_001253bb:
  if (bVar15) {
    return 0;
  }
  return EVar11;
}

Assistant:

Error RALocalAllocator::allocBranch(InstNode* node, RABlock* target, RABlock* cont) noexcept {
  // TODO: This should be used to make the branch allocation better.
  DebugUtils::unused(cont);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // Use TryMode of `switchToAssignment()` if possible.
  if (target->hasEntryAssignment()) {
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), true));
  }

  ASMJIT_PROPAGATE(allocInst(node));
  ASMJIT_PROPAGATE(spillRegsBeforeEntry(target));

  if (target->hasEntryAssignment()) {
    BaseNode* injectionPoint = _pass->extraBlock()->prev();
    BaseNode* prevCursor = _cc->setCursor(injectionPoint);

    _tmpAssignment.copyFrom(_curAssignment);
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), false));

    BaseNode* curCursor = _cc->cursor();
    if (curCursor != injectionPoint) {
      // Additional instructions emitted to switch from the current state to the `target` state. This means
      // that we have to move these instructions into an independent code block and patch the jump location.
      Operand& targetOp = node->op(node->opCount() - 1);
      if (ASMJIT_UNLIKELY(!targetOp.isLabel())) {
        return DebugUtils::errored(kErrorInvalidState);
      }

      Label trampoline = _cc->newLabel();
      Label savedTarget = targetOp.as<Label>();

      // Patch `target` to point to the `trampoline` we just created.
      targetOp = trampoline;

      // Clear a possible SHORT form as we have no clue now if the SHORT form would be encodable after patching
      // the target to `trampoline` (X86 specific).
      node->clearOptions(InstOptions::kShortForm);

      // Finalize the switch assignment sequence.
      ASMJIT_PROPAGATE(_pass->emitJump(savedTarget));
      _cc->_setCursor(injectionPoint);
      _cc->bind(trampoline);
    }

    _cc->_setCursor(prevCursor);
    _curAssignment.swap(_tmpAssignment);
  }
  else {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(target, block(), _curAssignment));
  }

  return kErrorOk;
}